

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_serialization.hpp
# Opt level: O2

void duckdb::FunctionSerializer::Serialize<duckdb::TableFunction>
               (Serializer *serializer,TableFunction *function,
               optional_ptr<duckdb::FunctionData,_true> bind_info)

{
  anon_class_16_2_9281c563 f;
  bool has_serialize;
  bool local_21;
  optional_ptr<duckdb::FunctionData,_true> local_20;
  
  local_20.ptr = bind_info.ptr;
  Serializer::WriteProperty<std::__cxx11::string>
            (serializer,500,"name",
             &(function->super_SimpleNamedParameterFunction).super_SimpleFunction.super_Function.
              name);
  Serializer::WriteProperty<duckdb::vector<duckdb::LogicalType,true>>
            (serializer,0x1f5,"arguments",
             &(function->super_SimpleNamedParameterFunction).super_SimpleFunction.arguments);
  Serializer::WriteProperty<duckdb::vector<duckdb::LogicalType,true>>
            (serializer,0x1f6,"original_arguments",
             &(function->super_SimpleNamedParameterFunction).super_SimpleFunction.original_arguments
            );
  local_21 = function->serialize != (table_function_serialize_t)0x0;
  Serializer::WriteProperty<bool>(serializer,0x1f7,"has_serialize",&local_21);
  if (local_21 == true) {
    f.bind_info = &local_20;
    f.function = function;
    Serializer::
    WriteObject<duckdb::FunctionSerializer::Serialize<duckdb::TableFunction>(duckdb::Serializer&,duckdb::TableFunction_const&,duckdb::optional_ptr<duckdb::FunctionData,true>)::_lambda(duckdb::Serializer&)_1_>
              (serializer,0x1f8,"function_data",f);
  }
  return;
}

Assistant:

static void Serialize(Serializer &serializer, const FUNC &function, optional_ptr<FunctionData> bind_info) {
		D_ASSERT(!function.name.empty());
		serializer.WriteProperty(500, "name", function.name);
		serializer.WriteProperty(501, "arguments", function.arguments);
		serializer.WriteProperty(502, "original_arguments", function.original_arguments);
		bool has_serialize = function.serialize;
		serializer.WriteProperty(503, "has_serialize", has_serialize);
		if (has_serialize) {
			serializer.WriteObject(504, "function_data",
			                       [&](Serializer &obj) { function.serialize(obj, bind_info, function); });
			D_ASSERT(function.deserialize);
		}
	}